

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

bool __thiscall
cmQtAutoMocUic::JobGenerateT::UicUpdate(JobGenerateT *this,MappingT *mapping,string *reason)

{
  string *fileName;
  element_type *text;
  void *pvVar1;
  bool bVar2;
  cmFileTime outputFileTime;
  string local_50;
  cmFileTime local_30;
  
  text = (mapping->SourceFile).
         super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  fileName = &mapping->OutputFile;
  local_30.NS = 0;
  bVar2 = cmFileTime::Load(&local_30,fileName);
  if (bVar2) {
    pvVar1 = ((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_;
    if (*(char *)((long)pvVar1 + 0x5b1) == '\x01') {
      if (reason == (string *)0x0) {
        return true;
      }
      std::__cxx11::string::_M_replace((ulong)reason,0,(char *)reason->_M_string_length,0x512252);
      cmQtAutoGen::Quoted(&local_50,fileName);
      std::__cxx11::string::_M_append((char *)reason,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)reason);
      cmQtAutoGen::Quoted(&local_50,&text->FileName);
      std::__cxx11::string::_M_append((char *)reason,(ulong)local_50._M_dataplus._M_p);
    }
    else if (local_30.NS <
             (((mapping->SourceFile).
               super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             FileTime).NS) {
      if (reason == (string *)0x0) {
        return true;
      }
      std::__cxx11::string::_M_replace((ulong)reason,0,(char *)reason->_M_string_length,0x512252);
      cmQtAutoGen::Quoted(&local_50,fileName);
      std::__cxx11::string::_M_append((char *)reason,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)reason);
      cmQtAutoGen::Quoted(&local_50,&text->FileName);
      std::__cxx11::string::_M_append((char *)reason,(ulong)local_50._M_dataplus._M_p);
    }
    else {
      if (*(long *)((long)pvVar1 + 0x5b8) <= local_30.NS) {
        return false;
      }
      if (reason == (string *)0x0) {
        return true;
      }
      std::__cxx11::string::_M_replace((ulong)reason,0,(char *)reason->_M_string_length,0x512252);
      cmQtAutoGen::Quoted(&local_50,fileName);
      std::__cxx11::string::_M_append((char *)reason,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)reason);
      cmQtAutoGen::Quoted(&local_50,&text->FileName);
      std::__cxx11::string::_M_append((char *)reason,(ulong)local_50._M_dataplus._M_p);
    }
  }
  else {
    if (reason == (string *)0x0) {
      return true;
    }
    std::__cxx11::string::_M_replace((ulong)reason,0,(char *)reason->_M_string_length,0x512252);
    cmQtAutoGen::Quoted(&local_50,fileName);
    std::__cxx11::string::_M_append((char *)reason,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)reason);
    cmQtAutoGen::Quoted(&local_50,&text->FileName);
    std::__cxx11::string::_M_append((char *)reason,(ulong)local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmQtAutoMocUic::JobGenerateT::UicUpdate(MappingT const& mapping,
                                             std::string* reason) const
{
  std::string const& sourceFile = mapping.SourceFile->FileName;
  std::string const& outputFile = mapping.OutputFile;

  // Test if the build file exists
  cmFileTime outputFileTime;
  if (!outputFileTime.Load(outputFile)) {
    if (reason != nullptr) {
      *reason = "Generating ";
      *reason += Quoted(outputFile);
      *reason += ", because it doesn't exist, from ";
      *reason += Quoted(sourceFile);
    }
    return true;
  }

  // Test if the uic settings changed
  if (UicConst().SettingsChanged) {
    if (reason != nullptr) {
      *reason = "Generating ";
      *reason += Quoted(outputFile);
      *reason += ", because the uic settings changed, from ";
      *reason += Quoted(sourceFile);
    }
    return true;
  }

  // Test if the source file is newer
  if (outputFileTime.Older(mapping.SourceFile->FileTime)) {
    if (reason != nullptr) {
      *reason = "Generating ";
      *reason += Quoted(outputFile);
      *reason += " because it's older than the source file ";
      *reason += Quoted(sourceFile);
    }
    return true;
  }

  // Test if the uic executable is newer
  if (outputFileTime.Older(UicConst().ExecutableTime)) {
    if (reason != nullptr) {
      *reason = "Generating ";
      *reason += Quoted(outputFile);
      *reason += ", because it's older than the uic executable, from ";
      *reason += Quoted(sourceFile);
    }
    return true;
  }

  return false;
}